

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segmentation.cpp
# Opt level: O0

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* pobr::imgProcessing::utils::segmentation::getImageSegmentsScanMerge
            (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *__return_storage_ptr__,Mat *img,bool *useDiagonalDetection)

{
  __node_base_ptr *this;
  int iVar1;
  int iVar2;
  value_type *pvVar3;
  bool bVar4;
  value_type *pvVar5;
  undefined1 *puVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  Segment *pSVar9;
  reference pvVar10;
  reference ppSVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  Segment **segmentPtr_1;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
  *__range1_2;
  Segment *local_368;
  Segment *segmentPtr;
  reference_wrapper<pobr::imgProcessing::structs::Segment> *segment_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  *__range1_1;
  unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
  uniqSegments;
  value_type *touched;
  value_type_conflict *touchesIdx;
  const_iterator __end2;
  const_iterator __begin2;
  mapped_type *__range2;
  mapped_type *local_2d8;
  mapped_type *touching;
  Segment *segment_1;
  value_type *segmentRef;
  uint64_t segmentIdx;
  reference local_2b0;
  Segment *segment;
  iterator __end1;
  iterator __begin1;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *__range1;
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  segmentsRefs;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_double_&,_const_cv::Mat_&)>
  local_258;
  anon_class_16_2_8a962d97 local_238;
  function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&)>
  local_228;
  matrixOps local_208 [112];
  Mat local_198 [8];
  Mat lookupKernel;
  undefined8 local_138;
  double lookupKernelValues [9];
  unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
  touchingSegments;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  segmentsBoundaries;
  Mat local_80 [8];
  Mat segmentsIDs;
  bool *useDiagonalDetection_local;
  Mat *img_local;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *segments;
  
  iVar1 = *(int *)(img + 8);
  iVar2 = *(int *)(img + 0xc);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)
             &segmentsBoundaries.
              super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0.0);
  cv::Mat::Mat(local_80,iVar1,iVar2,6,
               (Scalar_ *)
               &segmentsBoundaries.
                super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *)&touchingSegments._M_h._M_single_bucket);
  std::
  unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
  ::unordered_map((unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
                   *)(lookupKernelValues + 8));
  memset(&local_138,0,0x48);
  lookupKernelValues[0] = 1.0;
  lookupKernelValues[2] = 1.0;
  lookupKernelValues[4] = 1.0;
  lookupKernelValues[6] = 1.0;
  if ((*useDiagonalDetection & 1U) != 0) {
    local_138 = 0x3ff0000000000000;
    lookupKernelValues[1] = 1.0;
    lookupKernelValues[5] = 1.0;
    lookupKernelValues[7] = 1.0;
  }
  cv::Mat::Mat(local_198,3,3,6,&local_138,0);
  local_238.touchingSegments =
       (unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
        *)(lookupKernelValues + 8);
  local_238.img = img;
  std::
  function<double(unsigned_long_const&,unsigned_long_const&,double&,double_const&,double_const&)>::
  function<pobr::imgProcessing::utils::segmentation::getImageSegmentsScanMerge(cv::Mat_const&,bool_const&)::__0,void>
            ((function<double(unsigned_long_const&,unsigned_long_const&,double&,double_const&,double_const&)>
              *)&local_228,&local_238);
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)img;
  std::function<void(unsigned_long_const&,unsigned_long_const&,double&,double&,cv::Mat_const&)>::
  function<pobr::imgProcessing::utils::segmentation::getImageSegmentsScanMerge(cv::Mat_const&,bool_const&)::__1,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&,double&,double&,cv::Mat_const&)>
              *)&local_258,
             (anon_class_32_4_d7f8a3ff *)
             &segmentsRefs.
              super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  matrixOps::applyKernel<double,double,double>
            (local_208,local_80,local_198,0.0,&local_228,&local_258);
  cv::Mat::~Mat((Mat *)local_208);
  std::
  function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_double_&,_const_cv::Mat_&)>
  ::~function(&local_258);
  std::
  function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&)>
  ::~function(&local_228);
  std::
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ::vector((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
            *)&__range1);
  this = &touchingSegments._M_h._M_single_bucket;
  __end1 = std::
           vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           ::begin((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    *)this);
  segment = (Segment *)
            std::
            vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            ::end((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                   *)this);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                                     *)&segment), bVar4) {
    local_2b0 = __gnu_cxx::
                __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                ::operator*(&__end1);
    segmentIdx = (uint64_t)std::ref<pobr::imgProcessing::structs::Segment>(local_2b0);
    std::
    vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
    ::push_back((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                 *)&__range1,(value_type *)&segmentIdx);
    __gnu_cxx::
    __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
    ::operator++(&__end1);
  }
  for (segmentRef = (value_type *)0x0; pvVar3 = segmentRef,
      pvVar5 = (value_type *)
               std::
               vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
               ::size((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                       *)&__range1), pvVar3 < pvVar5;
      segmentRef = (value_type *)((long)&segmentRef->_M_data + 1)) {
    segment_1 = (Segment *)
                std::
                vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                ::at((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                      *)&__range1,(size_type)segmentRef);
    touching = (mapped_type *)
               std::reference_wrapper<pobr::imgProcessing::structs::Segment>::get
                         ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)segment_1);
    puVar6 = (undefined1 *)((long)&segmentRef->_M_data + 1);
    auVar13._8_4_ = (int)((ulong)puVar6 >> 0x20);
    auVar13._0_8_ = puVar6;
    auVar13._12_4_ = 0x45300000;
    __range2 = (mapped_type *)
               ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)puVar6) - 4503599627370496.0));
    pmVar7 = std::
             unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
             ::at((unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
                   *)(lookupKernelValues + 8),(key_type *)&__range2);
    local_2d8 = pmVar7;
    __end2 = std::
             unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
             ::begin(pmVar7);
    touchesIdx = (value_type_conflict *)
                 std::
                 unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
                 ::end(pmVar7);
    while (bVar4 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<double,_false>,
                              (_Node_iterator_base<double,_false> *)&touchesIdx), bVar4) {
      pvVar8 = std::__detail::_Node_const_iterator<double,_true,_false>::operator*(&__end2);
      uVar12 = (ulong)(*pvVar8 + -1.0);
      uniqSegments._M_h._M_single_bucket =
           (__node_base_ptr)
           std::
           vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
           ::at((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                 *)&__range1,
                uVar12 | (long)((*pvVar8 + -1.0) - 9.223372036854776e+18) & (long)uVar12 >> 0x3f);
      pmVar7 = touching;
      pSVar9 = std::reference_wrapper::operator_cast_to_Segment_
                         ((reference_wrapper *)uniqSegments._M_h._M_single_bucket);
      structs::Segment::merge((Segment *)pmVar7,pSVar9);
      pSVar9 = segment_1;
      uVar12 = (ulong)(*pvVar8 + -1.0);
      pvVar10 = std::
                vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                ::at((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                      *)&__range1,
                     uVar12 | (long)((*pvVar8 + -1.0) - 9.223372036854776e+18) &
                              (long)uVar12 >> 0x3f);
      pvVar10->_M_data = (Segment *)pSVar9->xMin;
      std::__detail::_Node_const_iterator<double,_true,_false>::operator++(&__end2);
    }
  }
  std::
  unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
  ::unordered_set((unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
                   *)&__range1_1);
  __end1_1 = std::
             vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
             ::begin((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                      *)&__range1);
  segment_2 = (reference_wrapper<pobr::imgProcessing::structs::Segment> *)
              std::
              vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
              ::end((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                     *)&__range1);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_*,_std::vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>_>
                             *)&segment_2), bVar4) {
    segmentPtr = (Segment *)
                 __gnu_cxx::
                 __normal_iterator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_*,_std::vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>_>
                 ::operator*(&__end1_1);
    local_368 = std::reference_wrapper<pobr::imgProcessing::structs::Segment>::get
                          ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)segmentPtr);
    std::
    unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
    ::insert((unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
              *)&__range1_1,&local_368);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_*,_std::vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector(__return_storage_ptr__);
  __end1_2 = std::
             unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
             ::begin((unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
                      *)&__range1_1);
  segmentPtr_1 = (Segment **)
                 std::
                 unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
                 ::end((unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
                        *)&__range1_1);
  while (bVar4 = std::__detail::operator!=
                           (&__end1_2.
                             super__Node_iterator_base<pobr::imgProcessing::structs::Segment_*,_false>
                            ,(_Node_iterator_base<pobr::imgProcessing::structs::Segment_*,_false> *)
                             &segmentPtr_1), bVar4) {
    ppSVar11 = std::__detail::_Node_iterator<pobr::imgProcessing::structs::Segment_*,_true,_false>::
               operator*(&__end1_2);
    std::
    vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    ::push_back(__return_storage_ptr__,*ppSVar11);
    std::__detail::_Node_iterator<pobr::imgProcessing::structs::Segment_*,_true,_false>::operator++
              (&__end1_2);
  }
  std::
  unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
  ::~unordered_set((unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
                    *)&__range1_1);
  std::
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ::~vector((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
             *)&__range1);
  cv::Mat::~Mat(local_198);
  std::
  unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
  ::~unordered_map((unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
                    *)(lookupKernelValues + 8));
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *)&touchingSegments._M_h._M_single_bucket);
  cv::Mat::~Mat(local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<structs::Segment>
segmentation::getImageSegmentsScanMerge(const cv::Mat& img, const bool& useDiagonalDetection)
{
    auto segmentsIDs = cv::Mat(
        img.rows,
        img.cols,
        CV_64F,
        0.0
    );
    std::vector<structs::Segment> segmentsBoundaries;
    std::unordered_map<double, std::unordered_set<double>> touchingSegments;

    double lookupKernelValues[9] = {
        0, 1, 0,
        1, 0, 1,
        0, 1, 0     
    };

    if (useDiagonalDetection) {
        lookupKernelValues[0] = 1;
        lookupKernelValues[2] = 1;
        lookupKernelValues[6] = 1;
        lookupKernelValues[8] = 1;
    }

    auto lookupKernel = cv::Mat(
        3,
        3,
        CV_64F,
        lookupKernelValues
    );

    // Note: Kernel application skips img edges
    //       replace with forEachPixel maybe?
    matrixOps::applyKernel<double, double, double>(
        segmentsIDs,
        lookupKernel,
        0,
        [&](const uint64_t& x, const uint64_t& y, double& accumulator, const double& segmentID, const double& kernelValue) -> double
        {
            const auto& imgPixel = img.at<cv::Vec3b>(y, x);

            if (imgPixel[0] == consts::colors::black) {
                // Short-circuit as there is nothing to do here
                return 0;
            }

            if (kernelValue == 0) {
                return accumulator;
            }

            if (accumulator != 0) {
                if (segmentID == 0 || accumulator == segmentID) {
                    return accumulator;
                }

                // Segments touching, store that information for merging phase
                touchingSegments.at(accumulator).insert(segmentID);
                touchingSegments.at(segmentID).insert(accumulator);
            }

            return segmentID;
        },
        [&](const uint64_t& x, const uint64_t& y, double& accumulator, double& setSegmentID, const cv::Mat& tt) -> void
        {
            const auto& imgPixel = img.at<cv::Vec3b>(y, x);

            if (imgPixel[0] == consts::colors::black) {
                // Short-circuit as there is nothing to do here
                return;
            }

            if (accumulator == 0) {
                // Not IDed yet, create new segment

                const auto thisSegmentID = segmentsBoundaries.size() + 1;
                structs::Segment newSegment;

                newSegment.xMin = x;
                newSegment.xMax = x;
                newSegment.yMin = y;
                newSegment.yMax = y;

                segmentsIDs.at<double>(y, x) = thisSegmentID;
                segmentsBoundaries.push_back(newSegment);
                touchingSegments.insert({ thisSegmentID, {} });
            } else {
                // Segment exists, update boundaries

                const auto thisSegmentID = accumulator;
                auto& thisSegment = segmentsBoundaries.at(thisSegmentID - 1);

                segmentsIDs.at<double>(y, x) = thisSegmentID;
                thisSegment.updateBoundaries(x, y);
            }
        }
    );

    // Merge touching segments
    std::vector<std::reference_wrapper<structs::Segment>> segmentsRefs;

    for (auto& segment: segmentsBoundaries) {
        segmentsRefs.push_back(std::ref(segment));
    }

    for (uint64_t segmentIdx = 0; segmentIdx < segmentsRefs.size(); segmentIdx++) {
        const auto& segmentRef = segmentsRefs.at(segmentIdx);
        auto& segment = segmentRef.get();
        const auto& touching = touchingSegments.at(segmentIdx + 1);

        for (const auto& touchesIdx: touching) {
            const auto& touched = segmentsRefs.at(touchesIdx - 1);

            segment.merge(touched);
            segmentsRefs.at(touchesIdx - 1) = segmentRef;
        }
    }

    std::unordered_set<structs::Segment*> uniqSegments;
    for (const auto& segment: segmentsRefs) {
        structs::Segment* segmentPtr = &(segment.get());

        uniqSegments.insert(segmentPtr);
    }

    std::vector<structs::Segment> segments;
    for (const auto& segmentPtr: uniqSegments) {
        segments.push_back((*segmentPtr));
    }

    // Note: does not update Segment's pixels

    return segments;
}